

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

QString * borderStyleName(BorderStyle style)

{
  long lVar1;
  QByteArrayView *this;
  uint in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QString *pQVar14;
  storage_type *local_c8;
  storage_type *local_b8;
  storage_type *local_a8;
  storage_type *local_98;
  storage_type *local_88;
  storage_type *local_78;
  storage_type *local_68;
  storage_type *local_58;
  storage_type *local_48;
  storage_type *local_38;
  storage_type *local_28;
  storage_type *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QByteArrayView *)(ulong)in_ESI;
  pQVar14 = in_RDI;
  switch(this) {
  case (QByteArrayView *)0x0:
    QByteArrayView::QByteArrayView<5ul>(this,(char (*) [5])in_RDI);
    QVar2.m_data = local_18;
    QVar2.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar2);
    break;
  case (QByteArrayView *)0x1:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar3.m_data = local_28;
    QVar3.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar3);
    break;
  case (QByteArrayView *)0x2:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar4.m_data = local_38;
    QVar4.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar4);
    break;
  case (QByteArrayView *)0x3:
    QByteArrayView::QByteArrayView<6ul>(this,(char (*) [6])in_RDI);
    QVar5.m_data = local_48;
    QVar5.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar5);
    break;
  case (QByteArrayView *)0x4:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar6.m_data = local_58;
    QVar6.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar6);
    break;
  case (QByteArrayView *)0x5:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar7.m_data = local_68;
    QVar7.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar7);
    break;
  case (QByteArrayView *)0x6:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar8.m_data = local_78;
    QVar8.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar8);
    break;
  case (QByteArrayView *)0x7:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar9.m_data = local_88;
    QVar9.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar9);
    break;
  case (QByteArrayView *)0x8:
    QByteArrayView::QByteArrayView<6ul>(this,(char (*) [6])in_RDI);
    QVar10.m_data = local_98;
    QVar10.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar10);
    break;
  case (QByteArrayView *)0x9:
    QByteArrayView::QByteArrayView<6ul>(this,(char (*) [6])in_RDI);
    QVar11.m_data = local_a8;
    QVar11.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar11);
    break;
  case (QByteArrayView *)0xa:
    QByteArrayView::QByteArrayView<7ul>(this,(char (*) [7])in_RDI);
    QVar12.m_data = local_b8;
    QVar12.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar12);
    break;
  default:
    QByteArrayView::QByteArrayView<1ul>(this,(char (*) [1])in_RDI);
    QVar13.m_data = local_c8;
    QVar13.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar13);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar14;
}

Assistant:

static QString borderStyleName(QTextFrameFormat::BorderStyle style)
{
    switch (style) {
    case QTextFrameFormat::BorderStyle_None:
        return QString::fromLatin1("none");
    case QTextFrameFormat::BorderStyle_Dotted:
        return QString::fromLatin1("dotted");
    case QTextFrameFormat::BorderStyle_Dashed:
        return QString::fromLatin1("dashed");
    case QTextFrameFormat::BorderStyle_Solid:
        return QString::fromLatin1("solid");
    case QTextFrameFormat::BorderStyle_Double:
        return QString::fromLatin1("double");
    case QTextFrameFormat::BorderStyle_DotDash:
        return QString::fromLatin1("dashed");
    case QTextFrameFormat::BorderStyle_DotDotDash:
        return QString::fromLatin1("dotted");
    case QTextFrameFormat::BorderStyle_Groove:
        return QString::fromLatin1("groove");
    case QTextFrameFormat::BorderStyle_Ridge:
        return QString::fromLatin1("ridge");
    case QTextFrameFormat::BorderStyle_Inset:
        return QString::fromLatin1("inset");
    case QTextFrameFormat::BorderStyle_Outset:
        return QString::fromLatin1("outset");
    }
    return QString::fromLatin1("");
}